

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O1

string * __thiscall
pbrt::SurfaceInteraction::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SurfaceInteraction *this)

{
  ulong uVar1;
  MediumInterface *this_00;
  ulong uVar2;
  ulong uVar3;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  uVar1 = (this->super_Interaction).medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  local_b8 = "(nullptr)";
  if ((uVar1 & 0xffffffffffff) != 0) {
    MediumHandle::ToString_abi_cxx11_(&local_50,&(this->super_Interaction).medium);
    local_b8 = local_50._M_dataplus._M_p;
  }
  this_00 = (this->super_Interaction).mediumInterface;
  local_c0 = "(nullptr)";
  if (this_00 != (MediumInterface *)0x0) {
    MediumInterface::ToString_abi_cxx11_(&local_70,this_00);
    local_c0 = local_70._M_dataplus._M_p;
  }
  uVar2 = (this->material).
          super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          .bits;
  local_c8 = "(nullptr)";
  if ((uVar2 & 0xffffffffffff) != 0) {
    MaterialHandle::ToString_abi_cxx11_(&local_90,&this->material);
    local_c8 = local_90._M_dataplus._M_p;
  }
  uVar3 = (this->areaLight).
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          .bits;
  local_d0 = "(nullptr)";
  if ((uVar3 & 0xffffffffffff) != 0) {
    LightHandle::ToString_abi_cxx11_(&local_b0,&this->areaLight);
    local_d0 = local_b0._M_dataplus._M_p;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Point3fi_const&,pbrt::Normal3<float>const&,pbrt::Point2<float>const&,pbrt::Vector3<float>const&,float_const&,char_const*,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,char_const*,char_const*,pbrt::Vector3<float>&,pbrt::Vector3<float>&,float&,float&,float&,float&,int_const&>
            (__return_storage_ptr__,
             "[ SurfaceInteraction pi: %s n: %s uv: %s wo: %s time: %s medium: %s mediumInterface: %s dpdu: %s dpdv: %s dndu: %s dndv: %s shading.n: %s shading.dpdu: %s shading.dpdv: %s shading.dndu: %s shading.dndv: %s material: %s areaLight: %s dpdx: %s dpdy: %s dudx: %f dvdx: %f dudy: %f dvdy: %f faceIndex: %d ]"
             ,(Point3fi *)this,&(this->super_Interaction).n,&(this->super_Interaction).uv,
             &(this->super_Interaction).wo,&(this->super_Interaction).time,&local_b8,&local_c0,
             &this->dpdu,&this->dpdv,&this->dndu,&this->dndv,&(this->shading).n,
             &(this->shading).dpdu,&(this->shading).dpdv,&(this->shading).dndu,&(this->shading).dndv
             ,&local_c8,&local_d0,&this->dpdx,&this->dpdy,&this->dudx,&this->dvdx,&this->dudy,
             &this->dvdy,&this->faceIndex);
  if (((uVar3 & 0xffffffffffff) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2)) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (((uVar2 & 0xffffffffffff) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((this_00 != (MediumInterface *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (((uVar1 & 0xffffffffffff) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SurfaceInteraction::ToString() const {
    return StringPrintf(
        "[ SurfaceInteraction pi: %s n: %s uv: %s wo: %s time: %s "
        "medium: %s mediumInterface: %s dpdu: %s dpdv: %s dndu: %s dndv: %s "
        "shading.n: %s shading.dpdu: %s shading.dpdv: %s "
        "shading.dndu: %s shading.dndv: %s material: %s "
        "areaLight: %s dpdx: %s dpdy: %s dudx: %f dvdx: %f "
        "dudy: %f dvdy: %f faceIndex: %d ]",
        pi, n, uv, wo, time, medium ? medium.ToString().c_str() : "(nullptr)",
        mediumInterface ? mediumInterface->ToString().c_str() : "(nullptr)", dpdu, dpdv,
        dndu, dndv, shading.n, shading.dpdu, shading.dpdv, shading.dndu, shading.dndv,
        material ? material.ToString().c_str() : "(nullptr)",
        areaLight ? areaLight.ToString().c_str() : "(nullptr)", dpdx, dpdy, dudx, dvdx,
        dudy, dvdy, faceIndex);
}